

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

void start_pass_huff(j_compress_ptr cinfo,boolean gather_statistics)

{
  uint uVar1;
  jpeg_entropy_encoder *pjVar2;
  jpeg_component_info *pjVar3;
  jpeg_error_mgr *pjVar4;
  _func_void_j_compress_ptr_boolean *p_Var5;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var6;
  _func_void_j_compress_ptr *p_Var7;
  code *pcVar8;
  long lVar9;
  
  pcVar8 = finish_pass_gather;
  if (gather_statistics == 0) {
    pcVar8 = finish_pass_huff;
  }
  pjVar2 = cinfo->entropy;
  pjVar2->finish_pass = pcVar8;
  if (cinfo->progressive_mode == 0) {
    if (gather_statistics == 0) {
      pcVar8 = encode_mcu_huff;
    }
    else {
      pcVar8 = encode_mcu_gather;
    }
    pjVar2->encode_mcu = pcVar8;
    goto LAB_00114fd0;
  }
  pjVar2[9].start_pass = (_func_void_j_compress_ptr_boolean *)cinfo;
  *(boolean *)&pjVar2[8].start_pass = gather_statistics;
  if (cinfo->Ah == 0) {
    if (cinfo->Ss == 0) {
      pcVar8 = encode_mcu_DC_first;
    }
    else {
      pcVar8 = encode_mcu_AC_first;
    }
LAB_00114fb0:
    pjVar2->encode_mcu = pcVar8;
  }
  else {
    if (cinfo->Ss == 0) {
      pcVar8 = encode_mcu_DC_refine;
      goto LAB_00114fb0;
    }
    pjVar2->encode_mcu = encode_mcu_AC_refine;
    if (pjVar2[10].start_pass == (_func_void_j_compress_ptr_boolean *)0x0) {
      p_Var5 = (_func_void_j_compress_ptr_boolean *)
               (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,1000);
      pjVar2[10].start_pass = p_Var5;
    }
  }
  *(int *)&pjVar2[9].encode_mcu = cinfo->cur_comp_info[0]->ac_tbl_no;
  *(undefined8 *)((long)&pjVar2[9].encode_mcu + 4) = 0;
LAB_00114fd0:
  if (0 < cinfo->comps_in_scan) {
    lVar9 = 0;
    do {
      pjVar3 = cinfo->cur_comp_info[lVar9];
      if ((cinfo->Ss == 0) && (cinfo->Ah == 0)) {
        uVar1 = pjVar3->dc_tbl_no;
        if (gather_statistics == 0) {
          jpeg_make_c_derived_tbl
                    (cinfo,1,uVar1,(c_derived_tbl **)(&pjVar2[2].finish_pass + (int)uVar1));
        }
        else {
          if (3 < uVar1) {
            pjVar4 = cinfo->err;
            pjVar4->msg_code = 0x34;
            (pjVar4->msg_parm).i[0] = uVar1;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if ((&pjVar2[5].encode_mcu)[(int)uVar1] ==
              (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)0x0) {
            p_Var6 = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)
                     (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x808);
            (&pjVar2[5].encode_mcu)[(int)uVar1] = p_Var6;
          }
          memset((&pjVar2[5].encode_mcu)[(int)uVar1],0,0x808);
        }
        *(undefined4 *)((long)&pjVar2[1].encode_mcu + lVar9 * 4 + 4) = 0;
      }
      if (cinfo->Se != 0) {
        uVar1 = pjVar3->ac_tbl_no;
        if (gather_statistics == 0) {
          jpeg_make_c_derived_tbl
                    (cinfo,0,uVar1,(c_derived_tbl **)(&pjVar2[4].start_pass + (int)uVar1));
        }
        else {
          if (3 < uVar1) {
            pjVar4 = cinfo->err;
            pjVar4->msg_code = 0x34;
            (pjVar4->msg_parm).i[0] = uVar1;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if ((&pjVar2[6].finish_pass)[(int)uVar1] == (_func_void_j_compress_ptr *)0x0) {
            p_Var7 = (_func_void_j_compress_ptr *)
                     (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x808);
            (&pjVar2[6].finish_pass)[(int)uVar1] = p_Var7;
          }
          memset((&pjVar2[6].finish_pass)[(int)uVar1],0,0x808);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < cinfo->comps_in_scan);
  }
  pjVar2[1].start_pass = (_func_void_j_compress_ptr_boolean *)0x0;
  *(undefined4 *)&pjVar2[1].encode_mcu = 0;
  *(uint *)&pjVar2[2].encode_mcu = cinfo->restart_interval;
  *(undefined4 *)((long)&pjVar2[2].encode_mcu + 4) = 0;
  return;
}

Assistant:

METHODDEF(void)
start_pass_huff (j_compress_ptr cinfo, boolean gather_statistics)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int ci, tbl;
  jpeg_component_info * compptr;

  if (gather_statistics)
    entropy->pub.finish_pass = finish_pass_gather;
  else
    entropy->pub.finish_pass = finish_pass_huff;

  if (cinfo->progressive_mode) {
    entropy->cinfo = cinfo;
    entropy->gather_statistics = gather_statistics;

    /* We assume jcmaster.c already validated the scan parameters. */

    /* Select execution routine */
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_first;
      else
	entropy->pub.encode_mcu = encode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_refine;
      else {
	entropy->pub.encode_mcu = encode_mcu_AC_refine;
	/* AC refinement needs a correction bit buffer */
	if (entropy->bit_buffer == NULL)
	  entropy->bit_buffer = (char *)
	    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
					MAX_CORR_BITS * SIZEOF(char));
      }
    }

    /* Initialize AC stuff */
    entropy->ac_tbl_no = cinfo->cur_comp_info[0]->ac_tbl_no;
    entropy->EOBRUN = 0;
    entropy->BE = 0;
  } else {
    if (gather_statistics)
      entropy->pub.encode_mcu = encode_mcu_gather;
    else
      entropy->pub.encode_mcu = encode_mcu_huff;
  }

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->Ss == 0 && cinfo->Ah == 0) {
      tbl = compptr->dc_tbl_no;
      if (gather_statistics) {
	/* Check for invalid table index */
	/* (make_c_derived_tbl does this in the other path) */
	if (tbl < 0 || tbl >= NUM_HUFF_TBLS)
	  ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tbl);
	/* Allocate and zero the statistics tables */
	/* Note that jpeg_gen_optimal_table expects 257 entries in each table! */
	if (entropy->dc_count_ptrs[tbl] == NULL)
	  entropy->dc_count_ptrs[tbl] = (long *)
	    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
					257 * SIZEOF(long));
	MEMZERO(entropy->dc_count_ptrs[tbl], 257 * SIZEOF(long));
      } else {
	/* Compute derived values for Huffman tables */
	/* We may do this more than once for a table, but it's not expensive */
	jpeg_make_c_derived_tbl(cinfo, TRUE, tbl,
				& entropy->dc_derived_tbls[tbl]);
      }
      /* Initialize DC predictions to 0 */
      entropy->saved.last_dc_val[ci] = 0;
    }
    /* AC needs no table when not present */
    if (cinfo->Se) {
      tbl = compptr->ac_tbl_no;
      if (gather_statistics) {
	if (tbl < 0 || tbl >= NUM_HUFF_TBLS)
	  ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tbl);
	if (entropy->ac_count_ptrs[tbl] == NULL)
	  entropy->ac_count_ptrs[tbl] = (long *)
	    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
					257 * SIZEOF(long));
	MEMZERO(entropy->ac_count_ptrs[tbl], 257 * SIZEOF(long));
      } else {
	jpeg_make_c_derived_tbl(cinfo, FALSE, tbl,
				& entropy->ac_derived_tbls[tbl]);
      }
    }
  }

  /* Initialize bit buffer to empty */
  entropy->saved.put_buffer = 0;
  entropy->saved.put_bits = 0;

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}